

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

Var Js::WebAssemblyModule::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyModule *pWVar7;
  int in_stack_00000010;
  undefined1 local_60 [8];
  WebAssemblySource src;
  undefined1 auStack_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x37,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00c1b955;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((auStack_38._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x3a,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00c1b955:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = Arguments::GetNewTarget((Arguments *)auStack_38);
  JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&src.sourceInfo);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    if (pvVar6 != (Var)0x0) {
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar6);
      if (BVar4 != 0) goto LAB_00c1b941;
    }
    if ((auStack_38._0_4_ & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_38,1);
      WebAssemblySource::WebAssemblySource((WebAssemblySource *)local_60,pvVar6,true,pSVar1);
      pWVar7 = CreateModule(pSVar1,(WebAssemblySource *)local_60);
      return pWVar7;
    }
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a6,(PCWSTR)0x0);
  }
LAB_00c1b941:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"WebAssembly.Module");
}

Assistant:

Var
WebAssemblyModule::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

    if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("WebAssembly.Module"));
    }

    if (args.Info.Count < 2)
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }

    WebAssemblySource src(args[1], true, scriptContext);
    return CreateModule(scriptContext, &src);
}